

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O3

char * __thiscall
Memory::
PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
::TryAllocDecommittedPages<false>
          (PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
           *this,uint pageCount,PageSegmentBase<Memory::VirtualAllocWrapper> **pageSegment)

{
  size_t *psVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_> *pDVar5;
  code *pcVar6;
  uint uVar7;
  bool bVar8;
  int iVar9;
  undefined4 *puVar10;
  PageSegmentBase<Memory::VirtualAllocWrapper> *this_00;
  char *pcVar11;
  DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *pDVar12;
  ulong uVar13;
  long lVar14;
  Iterator local_48;
  uint local_34;
  
  local_34 = pageCount;
  iVar9 = (*this->_vptr_PageAllocatorBase[3])();
  if ((char)iVar9 == '\0') {
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x45c,"(!this->HasMultiThreadAccess())","!this->HasMultiThreadAccess()");
    if (!bVar8) {
LAB_00705991:
      pcVar6 = (code *)invalidInstructionException();
      (*pcVar6)();
    }
    *puVar10 = 0;
  }
  local_48.list = &this->decommitSegments;
  local_48.current =
       &(local_48.list)->super_DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>;
  do {
    if ((DListNode<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_> *)local_48.current ==
        (DListNode<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar10 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                         ,0x66,"(current != nullptr)","current != nullptr");
      if (!bVar8) goto LAB_00705991;
      *puVar10 = 0;
    }
    local_48.current =
         (((DListNode<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_> *)local_48.current)->
         super_DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>).next.base;
    if ((DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *)
        local_48.current == local_48.list) {
      return (char *)0x0;
    }
    this_00 = DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount>::Iterator::
              Data(&local_48);
    uVar2 = this_00->freePageCount;
    uVar3 = this_00->decommitPageCount;
    pcVar11 = PageSegmentBase<Memory::VirtualAllocWrapper>::
              AllocDecommitPages<BVStatic<272ul>,false>
                        (this_00,local_34,(BVStatic<272UL>)*&(this_00->freePages).data,
                         (BVStatic<272UL>)*&(this_00->decommitPages).data);
    uVar7 = local_34;
    if (pcVar11 != (char *)0x0) {
      uVar4 = this_00->freePageCount;
      uVar13 = (this->freePageCount - (ulong)uVar2) + (ulong)uVar4;
      this->freePageCount = uVar13;
      this->decommitPageCount =
           (ulong)this_00->decommitPageCount + (this->decommitPageCount - (ulong)uVar3);
      if (uVar13 < this->debugMinFreePageCount) {
        this->debugMinFreePageCount = uVar13;
      }
      LogRecommitPages(this,(ulong)((local_34 - uVar2) + uVar4));
      lVar14 = (ulong)uVar7 * 0x1000;
      this->usedBytes = this->usedBytes + lVar14;
      LOCK();
      totalUsedBytes = totalUsedBytes + lVar14;
      UNLOCK();
      if (maxUsedBytes < totalUsedBytes) {
        maxUsedBytes = totalUsedBytes;
      }
      if (this->memoryData != (PageMemoryData *)0x0) {
        psVar1 = &this->memoryData->allocPageCount;
        *psVar1 = *psVar1 + (ulong)uVar7;
      }
      if (this_00->decommitPageCount == 0) {
        pDVar12 = GetSegmentList(this,this_00);
        pDVar5 = (((DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_> *)
                  &(local_48.current)->next)->next).base;
        (((((DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_> *)
           &(local_48.current)->next)->prev).base)->next).base = pDVar5;
        pDVar5->prev = ((DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_> *)
                       &(local_48.current)->next)->prev;
        pDVar5 = (pDVar12->
                 super_DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>).next.
                 base;
        ((DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_> *)
        &(local_48.current)->next)->prev = pDVar5->prev;
        (((DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_> *)
         &(local_48.current)->next)->next).base = pDVar5;
        *(NodeBase **)pDVar5->prev = local_48.current;
        (pDVar5->prev).node =
             (DListNode<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_> *)local_48.current;
        *(int *)&(((PageSegmentBase<Memory::VirtualAllocWrapper> *)&(local_48.list)->super_RealCount
                  )->super_SegmentBase<Memory::VirtualAllocWrapper>).super_SegmentBaseCommon.
                 allocator =
             *(int *)&(((PageSegmentBase<Memory::VirtualAllocWrapper> *)
                       &(local_48.list)->super_RealCount)->
                      super_SegmentBase<Memory::VirtualAllocWrapper>).super_SegmentBaseCommon.
                      allocator + -1;
        (pDVar12->super_RealCount).count = (pDVar12->super_RealCount).count + 1;
      }
      *pageSegment = this_00;
      return pcVar11;
    }
  } while( true );
}

Assistant:

char *
PageAllocatorBase<TVirtualAlloc, TSegment, TPageSegment>::TryAllocDecommittedPages(uint pageCount, TPageSegment ** pageSegment)
{
    Assert(!this->HasMultiThreadAccess());

    typename DListBase<TPageSegment>::EditingIterator i(&decommitSegments);

    while (i.Next())
    {
        TPageSegment * freeSegment = &i.Data();
        uint oldFreePageCount = freeSegment->GetFreePageCount();
        uint oldDecommitPageCount = freeSegment->GetDecommitPageCount();

        char * pages = freeSegment->template DoAllocDecommitPages<notPageAligned>(pageCount);
        if (pages != nullptr)
        {
            this->freePageCount = this->freePageCount - oldFreePageCount + freeSegment->GetFreePageCount();

#if DBG_DUMP
            this->decommitPageCount = this->decommitPageCount - oldDecommitPageCount + freeSegment->GetDecommitPageCount();
#endif
#if DBG
            UpdateMinimum(this->debugMinFreePageCount, this->freePageCount);
#endif
            uint recommitPageCount = pageCount - (oldFreePageCount - freeSegment->GetFreePageCount());
            LogRecommitPages(recommitPageCount);
            LogAllocPages(pageCount);

            if (freeSegment->GetDecommitPageCount() == 0)
            {
                auto toList = GetSegmentList(freeSegment);
                i.MoveCurrentTo(toList);
            }

            *pageSegment = freeSegment;
            return pages;
        }
    }
    return nullptr;
}